

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_1::PushConstantComputeTest::createInstance
          (PushConstantComputeTest *this,Context *context)

{
  PushConstantComputeTestInstance *this_00;
  Context *context_local;
  PushConstantComputeTest *this_local;
  
  this_00 = (PushConstantComputeTestInstance *)operator_new(0x178);
  PushConstantComputeTestInstance::PushConstantComputeTestInstance
            (this_00,context,this->m_pushConstantRange);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* PushConstantComputeTest::createInstance (Context& context) const
{
	return new PushConstantComputeTestInstance(context, m_pushConstantRange);
}